

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O1

uint8 * google::protobuf::internal::PrimitiveTypeHelper<17>::SerializeToArray
                  (void *ptr,uint8 *buffer)

{
  bool bVar1;
  uint8 *puVar2;
  uint8 *puVar3;
  uint uVar4;
  uint uVar5;
  
  uVar5 = *ptr >> 0x1f ^ *ptr * 2;
  if (uVar5 < 0x80) {
    *buffer = (byte)uVar5;
    return buffer + 1;
  }
  *buffer = (byte)uVar5 | 0x80;
  if (uVar5 < 0x4000) {
    buffer[1] = (uint8)(uVar5 >> 7);
    return buffer + 2;
  }
  puVar2 = buffer + 2;
  uVar5 = uVar5 >> 7;
  do {
    puVar3 = puVar2;
    puVar3[-1] = (byte)uVar5 | 0x80;
    uVar4 = uVar5 >> 7;
    bVar1 = 0x3fff < uVar5;
    puVar2 = puVar3 + 1;
    uVar5 = uVar4;
  } while (bVar1);
  *puVar3 = (uint8)uVar4;
  return puVar3 + 1;
}

Assistant:

static uint8* SerializeToArray(const void* ptr, uint8* buffer) {
    return WireFormatLite::WriteSInt32NoTagToArray(Get<Type>(ptr), buffer);
  }